

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::waitForFinished(QProcessPrivate *this,QDeadlineTimer *deadline)

{
  bool bVar1;
  int iVar2;
  pollfd *ppVar3;
  undefined8 in_RCX;
  nfds_t __nfds;
  pollfd *in_RSI;
  QProcessPrivate *in_RDI;
  long in_FS_OFFSET;
  int ret;
  QProcessPoller poller;
  QString *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  ProcessError in_stack_ffffffffffffff7c;
  QProcessPrivate *this_00;
  QProcessPrivate *in_stack_ffffffffffffff90;
  bool local_41;
  undefined1 local_40 [32];
  QObject **local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  QDynamicMetaObjectData *local_8;
  
  local_8 = *(QDynamicMetaObjectData **)(in_FS_OFFSET + 0x28);
  do {
    local_40._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_1185e52::QProcessPoller::QProcessPoller
              ((QProcessPoller *)in_stack_ffffffffffffff90,in_RDI);
    iVar2 = anon_unknown.dwarf_1185e52::QProcessPoller::poll
                      ((QProcessPoller *)(local_40 + 0x18),in_RSI,__nfds,(int)in_RCX);
    if (iVar2 < 0) {
      local_41 = false;
      goto LAB_007a329a;
    }
    if (iVar2 == 0) {
      this_00 = (QProcessPrivate *)local_40;
      QString::QString((QString *)0x7a318a);
      setError(this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
      QString::~QString((QString *)0x7a31aa);
      local_41 = false;
      goto LAB_007a329a;
    }
    ppVar3 = anon_unknown.dwarf_1185e52::QProcessPoller::stdinPipe
                       ((QProcessPoller *)(local_40 + 0x18));
    bVar1 = qt_pollfd_check(ppVar3,4);
    if (bVar1) {
      _q_canWrite((QProcessPrivate *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ppVar3 = anon_unknown.dwarf_1185e52::QProcessPoller::stdoutPipe
                       ((QProcessPoller *)(local_40 + 0x18));
    bVar1 = qt_pollfd_check(ppVar3,1);
    if (bVar1) {
      _q_canReadStandardOutput((QProcessPrivate *)0x7a3223);
    }
    ppVar3 = anon_unknown.dwarf_1185e52::QProcessPoller::stderrPipe
                       ((QProcessPoller *)(local_40 + 0x18));
    bVar1 = qt_pollfd_check(ppVar3,1);
    if (bVar1) {
      _q_canReadStandardError((QProcessPrivate *)0x7a324a);
    }
    if (in_RDI->processState == '\0') {
      local_41 = true;
      goto LAB_007a329a;
    }
    ppVar3 = anon_unknown.dwarf_1185e52::QProcessPoller::forkfd((QProcessPoller *)(local_40 + 0x18))
    ;
    bVar1 = qt_pollfd_check(ppVar3,1);
  } while (!bVar1);
  processFinished(in_stack_ffffffffffffff90);
  local_41 = true;
LAB_007a329a:
  if (*(QDynamicMetaObjectData **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QProcessPrivate::waitForFinished(const QDeadlineTimer &deadline)
{
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::waitForFinished(%lld)", deadline.remainingTime());
#endif

    forever {
        QProcessPoller poller(*this);

        int ret = poller.poll(deadline);

        if (ret < 0) {
            break;
        }
        if (ret == 0) {
            setError(QProcess::Timedout);
            return false;
        }

        if (qt_pollfd_check(poller.stdinPipe(), POLLOUT))
            _q_canWrite();

        if (qt_pollfd_check(poller.stdoutPipe(), POLLIN))
            _q_canReadStandardOutput();

        if (qt_pollfd_check(poller.stderrPipe(), POLLIN))
            _q_canReadStandardError();

        // Signals triggered by I/O may have stopped this process:
        if (processState == QProcess::NotRunning)
            return true;

        if (qt_pollfd_check(poller.forkfd(), POLLIN)) {
            processFinished();
            return true;
        }
    }